

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::UnknownFieldSetTest_ClearAndFreeMemory_Test::
~UnknownFieldSetTest_ClearAndFreeMemory_Test(UnknownFieldSetTest_ClearAndFreeMemory_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_UnknownFieldSetTest).super_Test._vptr_Test =
       (_func_int **)&PTR__UnknownFieldSetTest_019217b8;
  protobuf::internal::ZeroFieldsBase::~ZeroFieldsBase
            (&(this->super_UnknownFieldSetTest).empty_message_.super_ZeroFieldsBase);
  pcVar2 = (this->super_UnknownFieldSetTest).all_fields_data_._M_dataplus._M_p;
  paVar1 = &(this->super_UnknownFieldSetTest).all_fields_data_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  proto2_unittest::TestAllTypes::~TestAllTypes(&(this->super_UnknownFieldSetTest).all_fields_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x398);
  return;
}

Assistant:

TEST_F(UnknownFieldSetTest, ClearAndFreeMemory) {
  EXPECT_GT(unknown_fields_->field_count(), 0);
  unknown_fields_->ClearAndFreeMemory();
  EXPECT_EQ(0, unknown_fields_->field_count());
  unknown_fields_->AddVarint(123456, 654321);
  EXPECT_EQ(1, unknown_fields_->field_count());
}